

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O2

void __thiscall temp_box::temp_box(temp_box *this,cf_face *face,cf_vertex_vec *verts)

{
  uint uVar1;
  pointer pcVar2;
  temp_box *ptVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  fvector3 *this_00;
  ulong uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  long local_78;
  undefined1 *local_70;
  undefined1 local_68 [8];
  temp_box *local_60;
  fvector3 edge [3];
  
  this->state = 0;
  this_00 = edge + 2;
  uVar8 = 3;
  local_60 = this;
  for (lVar10 = 0; uVar4 = uVar8 / 3, lVar10 != -3; lVar10 = lVar10 + -1) {
    uVar8 = uVar8 - 1;
    pcVar2 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
             _M_impl.super__Vector_impl_data._M_start;
    xray_re::_vector3<float>::sub
              (this_00,&pcVar2[*(uint *)((long)face + lVar10 * 4 + uVar4 * -0xc + 0xc)].p,
               &pcVar2[*(uint *)((long)&face->field_0 + lVar10 * 4 + 8)].p);
    this_00 = this_00 + -1;
  }
  local_70 = (undefined1 *)((long)&face->field_0 + 0x10);
  uVar8 = 3;
  uVar4 = 4;
  lVar10 = 0x30;
  local_78 = 0x38;
  lVar7 = 0x24;
  lVar9 = -0x24;
  lVar6 = 0x18;
  local_68 = (undefined1  [8])face;
  do {
    uVar5 = uVar8 / 3;
    if (lVar9 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                    ,0x2f,"temp_box::temp_box(const cf_face &, const cf_vertex_vec &)");
    }
    uVar8 = uVar8 - 1;
    fVar11 = xray_re::_vector3<float>::cosine
                       ((_vector3<float> *)((long)&edge[0].field_0 + lVar6),
                        (_vector3<float> *)((long)&edge[uVar5 * -3].field_0 + lVar7));
    ptVar3 = local_60;
    local_70 = local_70 + -4;
    uVar4 = uVar4 - 1;
    lVar10 = lVar10 + -0xc;
    local_78 = local_78 + -0xc;
    lVar7 = lVar7 + -0xc;
    lVar9 = lVar9 + 0xc;
    lVar6 = lVar6 + -0xc;
  } while (0.001 <= (float)(~-(uint)(fVar11 < 0.0) & (uint)fVar11 |
                           (uint)(0.0 - fVar11) & -(uint)(fVar11 < 0.0)));
  xray_re::_vector3<float>::invert
            ((_vector3<float> *)&local_60->xform,(_vector3<float> *)((long)edge - lVar9));
  uVar4 = uVar4 / 3;
  *(undefined8 *)((long)&(ptVar3->xform).field_0 + 0x10) =
       *(undefined8 *)(local_68 + lVar10 + uVar4 * -0x24 + 0x10);
  (ptVar3->xform).field_0.field_0._23 = *(float *)(local_68 + local_78 + uVar4 * -0x24 + 0x10);
  uVar1 = *(uint *)(local_70 + uVar4 * -0xc);
  ptVar3->base_idx = uVar1;
  pcVar2 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
           _M_impl.super__Vector_impl_data._M_start;
  (ptVar3->xform).field_0.field_0._41 = pcVar2[uVar1].p.field_0.field_0.x;
  (ptVar3->xform).field_0.field_0._42 = pcVar2[uVar1].p.field_0.field_0.y;
  (ptVar3->xform).field_0.field_0._43 = pcVar2[uVar1].p.field_0.field_0.z;
  ptVar3->inner = *(uint16_t *)((long)((long)local_68 + 0x18) + 2);
  ptVar3->outer = *(ushort *)((long)local_68 + 0x18) & 0x3fff;
  return;
}

Assistant:

temp_box::temp_box(const cf_face& face, const cf_vertex_vec& verts): state(STATE_COLLECTING)
{
	fvector3 edge[3];
	for (uint_fast32_t i = 3; i != 0;) {
		--i;
		edge[i].sub(verts[face.v[(i+1)%3]].p, verts[face.v[i]].p);
	}
	for (uint_fast32_t i = 3; i != 0;) {
		uint_fast32_t j = i%3;
		if (equivalent(edge[--i].cosine(edge[j]), 0.f, k_zero_tolerance)) {
			xform.i.invert(edge[i]);
			xform.j.set(edge[j]);
			xform.c.set(verts[base_idx = face.v[j]].p);
			inner = face.sector;
			outer = face.material;
			return;
		}
	}
	xr_not_expected();
}